

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_decimal.cpp
# Opt level: O0

bool __thiscall
icu_63::numparse::impl::DecimalMatcher::validateGroup
          (DecimalMatcher *this,int32_t sepType,int32_t count,bool isPrimary)

{
  bool local_31;
  bool isPrimary_local;
  int32_t count_local;
  int32_t sepType_local;
  DecimalMatcher *this_local;
  
  if ((this->requireGroupingMatch & 1U) == 0) {
    if (sepType == 1) {
      this_local._7_1_ = count != 1;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else if (sepType == -1) {
    this_local._7_1_ = true;
  }
  else if (sepType == 0) {
    if (isPrimary) {
      this_local._7_1_ = true;
    }
    else {
      local_31 = false;
      if (count != 0) {
        local_31 = count <= this->grouping2;
      }
      this_local._7_1_ = local_31;
    }
  }
  else if (sepType == 1) {
    if (isPrimary) {
      this_local._7_1_ = count == this->grouping1;
    }
    else {
      this_local._7_1_ = count == this->grouping2;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DecimalMatcher::validateGroup(int32_t sepType, int32_t count, bool isPrimary) const {
    if (requireGroupingMatch) {
        if (sepType == -1) {
            // No such group (prevGroup before first shift).
            return true;
        } else if (sepType == 0) {
            // First group.
            if (isPrimary) {
                // No grouping separators is OK.
                return true;
            } else {
                return count != 0 && count <= grouping2;
            }
        } else if (sepType == 1) {
            // Middle group.
            if (isPrimary) {
                return count == grouping1;
            } else {
                return count == grouping2;
            }
        } else {
            U_ASSERT(sepType == 2);
            // After the decimal separator.
            return true;
        }
    } else {
        if (sepType == 1) {
            // #11230: don't accept middle groups with only 1 digit.
            return count != 1;
        } else {
            return true;
        }
    }
}